

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::stage_limits_are_supported
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  uint *puVar1;
  VkShaderStageFlagBits VVar2;
  uint uVar3;
  VkSpecializationInfo *pVVar4;
  VkSpecializationMapEntry *pVVar5;
  uint32_t uVar6;
  bool bVar7;
  long lVar8;
  const_iterator cVar9;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *pVVar10;
  char *pcVar11;
  uint uVar12;
  uint32_t *puVar13;
  bool bVar14;
  char *__rhs;
  long lVar15;
  ulong uVar16;
  DeferredEntryPoint *entry;
  int iVar17;
  uint32_t wg_size [3];
  uint32_t limit_workgroup_size [3];
  
  if (info->pName == (char *)0x0) {
    return false;
  }
  VVar2 = info->stage;
  if (VVar2 == VK_SHADER_STAGE_MESH_BIT_EXT) {
    limit_workgroup_size[2] = (this->props).mesh_shader.maxMeshWorkGroupSize[2];
    limit_workgroup_size._0_8_ = *(undefined8 *)(this->props).mesh_shader.maxMeshWorkGroupSize;
    iVar17 = 0x14f5;
    lVar8 = 0x1324;
  }
  else if (VVar2 == VK_SHADER_STAGE_TASK_BIT_EXT) {
    limit_workgroup_size[2] = (this->props).mesh_shader.maxTaskWorkGroupSize[2];
    limit_workgroup_size._0_8_ = *(undefined8 *)(this->props).mesh_shader.maxTaskWorkGroupSize;
    iVar17 = 0x14f4;
    lVar8 = 0x12f8;
  }
  else {
    if (VVar2 != VK_SHADER_STAGE_COMPUTE_BIT) {
      return true;
    }
    limit_workgroup_size[2] = (this->props2).properties.limits.maxComputeWorkGroupSize[2];
    limit_workgroup_size._0_8_ =
         *(undefined8 *)(this->props2).properties.limits.maxComputeWorkGroupSize;
    iVar17 = 5;
    lVar8 = 0x268;
  }
  uVar3 = *(uint *)((this->props2).properties.deviceName + lVar8 + -0x6c);
  std::mutex::lock(&this->module_to_info_lock);
  cVar9 = std::
          _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->module_to_info)._M_h,&info->module);
  bVar14 = true;
  if (cVar9.
      super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
      ._M_cur != (__node_type *)0x0) {
    lVar15 = *(long *)((long)cVar9.
                             super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
                             ._M_cur + 0x18);
    for (lVar8 = *(long *)((long)cVar9.
                                 super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
                                 ._M_cur + 0x10); lVar8 != lVar15; lVar8 = lVar8 + 0x60) {
      if (iVar17 == *(int *)(lVar8 + 0x50)) {
        __rhs = info->pName;
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar8 + 0x30),__rhs);
        if (bVar7) {
          wg_size[2] = 0;
          wg_size[0] = 0;
          wg_size[1] = 0;
          if ((*(int *)(lVar8 + 0x50) == 0x14f5) &&
             (((this->props).mesh_shader.maxMeshOutputPrimitives < *(uint *)(lVar8 + 0x58) ||
              ((this->props).mesh_shader.maxMeshOutputVertices < *(uint *)(lVar8 + 0x54)))))
          goto LAB_0010fbc1;
          pVVar4 = info->pSpecializationInfo;
          pcVar11 = (char *)0x0;
          goto LAB_0010fb33;
        }
      }
    }
  }
  goto LAB_0010fbc8;
LAB_0010fb33:
  do {
    if (pcVar11 == (char *)0x3) {
      uVar6 = wg_size[0];
      if (wg_size[1] * wg_size[0] * wg_size[2] <= uVar3) {
        if ((info->flags & 2) == 0) goto LAB_0010fbc8;
        pVVar10 = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                            ((VkStructureType)info->pNext,__rhs);
        puVar13 = &(this->props).subgroup_size_control.maxSubgroupSize;
        if (pVVar10 != (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)0x0) {
          puVar13 = &pVVar10->requiredSubgroupSize;
        }
        if ((*puVar13 != 0) && (uVar6 % *puVar13 == 0)) goto LAB_0010fbc8;
      }
      break;
    }
    uVar12 = *(uint *)(lVar8 + 4 + (long)pcVar11 * 4);
    wg_size[(long)pcVar11] = uVar12;
    if ((pVVar4 != (VkSpecializationInfo *)0x0 & pcVar11[lVar8 + 0x28]) == 1) {
      for (lVar15 = 0; (ulong)pVVar4->mapEntryCount << 4 != lVar15; lVar15 = lVar15 + 0x10) {
        pVVar5 = pVVar4->pMapEntries;
        if (((*(int *)((long)&pVVar5->constantID + lVar15) ==
              *(int *)(lVar8 + 0x1c + (long)pcVar11 * 4)) &&
            (*(long *)((long)&pVVar5->size + lVar15) == 4)) &&
           (uVar16 = (ulong)*(uint *)((long)&pVVar5->offset + lVar15),
           uVar16 + 4 <= pVVar4->dataSize)) {
          uVar12 = *(uint *)((long)pVVar4->pData + uVar16);
          wg_size[(long)pcVar11] = uVar12;
          break;
        }
      }
    }
    __rhs = pcVar11 + 1;
    puVar1 = limit_workgroup_size + (long)pcVar11;
    pcVar11 = __rhs;
  } while (uVar12 <= *puVar1);
LAB_0010fbc1:
  bVar14 = false;
LAB_0010fbc8:
  pthread_mutex_unlock((pthread_mutex_t *)&this->module_to_info_lock);
  return bVar14;
}

Assistant:

bool FeatureFilter::Impl::stage_limits_are_supported(const VkPipelineShaderStageCreateInfo &info) const
{
	spv::ExecutionModel target_model;
	uint32_t limit_workgroup_size[3];
	uint32_t limit_invocations;

	if (!info.pName)
		return false;

	switch (info.stage)
	{
	case VK_SHADER_STAGE_COMPUTE_BIT:
		target_model = spv::ExecutionModelGLCompute;
		memcpy(limit_workgroup_size, props2.properties.limits.maxComputeWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props2.properties.limits.maxComputeWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_TASK_BIT_EXT:
		target_model = spv::ExecutionModelTaskEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxTaskWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxTaskWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_MESH_BIT_EXT:
		target_model = spv::ExecutionModelMeshEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxMeshWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxMeshWorkGroupInvocations;
		break;

	default:
		// Shouldn't happen. Only happens for invalid input.
		return true;
	}

	std::lock_guard<std::mutex> holder{module_to_info_lock};

	// If we cannot find anything, assume that we're statically okay.
	auto itr = module_to_info.find(info.module);
	if (itr == module_to_info.end())
		return true;

	const DeferredEntryPoint *deferred_entry_point = nullptr;
	for (auto &entry : itr->second.deferred_entry_points)
	{
		if (target_model == entry.execution_model && entry.name == info.pName)
		{
			deferred_entry_point = &entry;
			break;
		}
	}

	if (deferred_entry_point)
	{
		auto &entry = *deferred_entry_point;
		uint32_t wg_size[3] = {};

		if (entry.execution_model == spv::ExecutionModelMeshEXT)
		{
			if (entry.max_primitives > props.mesh_shader.maxMeshOutputPrimitives)
				return false;
			if (entry.max_vertices > props.mesh_shader.maxMeshOutputVertices)
				return false;
		}

		for (unsigned i = 0; i < 3; i++)
		{
			wg_size[i] = entry.wg_size_literal[i];
			if (entry.has_constant_id[i] && info.pSpecializationInfo)
			{
				auto *data = static_cast<const uint8_t *>(info.pSpecializationInfo->pData);
				for (unsigned j = 0; j < info.pSpecializationInfo->mapEntryCount; j++)
				{
					auto &map_entry = info.pSpecializationInfo->pMapEntries[j];
					if (map_entry.constantID == entry.constant_id[i] &&
					    map_entry.size == sizeof(uint32_t) &&
					    map_entry.offset + sizeof(uint32_t) <= info.pSpecializationInfo->dataSize)
					{
						memcpy(&wg_size[i], data + map_entry.offset, sizeof(uint32_t));
						break;
					}
				}
			}

			if (wg_size[i] > limit_workgroup_size[i])
				return false;
		}

		if (wg_size[0] * wg_size[1] * wg_size[2] > limit_invocations)
			return false;

		if (info.flags & VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT)
		{
			auto *required = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>(
					VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT,
					info.pNext);

			uint32_t target_subgroup_size = required ?
					required->requiredSubgroupSize : props.subgroup_size_control.maxSubgroupSize;

			if (!target_subgroup_size)
				return false;

			if (wg_size[0] % target_subgroup_size != 0)
			{
				// Can only use full subgroups if we're guaranteed maxSubgroupSize is contained.
				// If we're using required size, we can statically validate it.
				return false;
			}
		}
	}

	return true;
}